

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::
BasicResult<Catch::Clara::ParseResultType>
          (BasicResult<Catch::Clara::Detail::ParseState> *this,
          BasicResult<Catch::Clara::ParseResultType> *other)

{
  ResultType RVar1;
  string *psVar2;
  BasicResult<Catch::Clara::ParseResultType> *other_local;
  BasicResult<Catch::Clara::Detail::ParseState> *this_local;
  
  RVar1 = Detail::BasicResult<Catch::Clara::ParseResultType>::type(other);
  ResultValueBase<Catch::Clara::Detail::ParseState>::ResultValueBase
            (&this->super_ResultValueBase<Catch::Clara::Detail::ParseState>,RVar1);
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_003a9d50;
  psVar2 = Detail::BasicResult<Catch::Clara::ParseResultType>::errorMessage_abi_cxx11_(other);
  std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)psVar2);
  RVar1 = type(this);
  if (RVar1 != Ok) {
    return;
  }
  __assert_fail("type() != ResultType::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                ,0x1226,
                "Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::Clara::Detail::ParseState, U = Catch::Clara::ParseResultType]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const& other ):
                    ResultValueBase<T>( other.type() ),
                    m_errorMessage( other.errorMessage() ) {
                    assert( type() != ResultType::Ok );
                }